

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::SrcDir_abi_cxx11_(void)

{
  size_type *psVar1;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  char cVar4;
  string *in_RDI;
  char *in_R8;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  long *local_88 [2];
  long local_78 [2];
  char *local_68;
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  FilePath argv_0;
  
  local_68 = "TEST_SRCDIR";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&internal::g_argvs_abi_cxx11_);
  psVar1 = &argv_0.pathname_._M_string_length;
  local_40 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,*(long *)local_60._0_8_,
             *(size_type *)(local_60._0_8_ + 8) + *(long *)local_60._0_8_);
  auVar2 = local_40;
  auVar3 = local_40;
  if (argv_0.pathname_._M_dataplus._M_p != (pointer)0x0) {
    do {
      cVar4 = (char)*(size_type *)auVar3;
      if (((cVar4 != '/') || (cVar4 = '/', auVar2 == local_40)) ||
         (*(char *)((long)auVar2 + -1) != '/')) {
        *(char *)auVar2 = cVar4;
        auVar2 = (undefined1  [8])((long)auVar2 + 1);
      }
      auVar3 = (undefined1  [8])((long)auVar3 + 1);
    } while (auVar3 != (undefined1  [8])(argv_0.pathname_._M_dataplus._M_p + (long)local_40));
  }
  argv_0.pathname_._M_dataplus._M_p = (pointer)((long)auVar2 - (long)local_40);
  *(char *)auVar2 = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  internal::FilePath::RemoveFileName((FilePath *)local_60,(FilePath *)local_40);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_60._0_8_,
             (pointer)(local_60._0_8_ + (long)(_Alloc_hider *)local_60._8_8_));
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  if (local_40 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_40,argv_0.pathname_._M_string_length + 1);
  }
  environment_variables._M_len = (size_type)local_88[0];
  environment_variables._M_array = (iterator)0x1;
  GetDirFromEnv_abi_cxx11_(in_RDI,(testing *)&local_68,environment_variables,in_R8,in_R9B);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}